

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OrderGrid.cpp
# Opt level: O0

void __thiscall OrderGrid::fontChanged(OrderGrid *this)

{
  int iVar1;
  QFont *font;
  int cellWidth;
  OrderGrid *this_local;
  
  font = QWidget::font(&this->super_QWidget);
  CellPainter::setFont(&this->mCellPainter,font);
  iVar1 = CellPainter::cellWidth(&this->mCellPainter);
  QRect::setX(&this->mGridRect,(iVar1 + 4) * 2 + 1);
  QRect::setWidth(&this->mGridRect,iVar1 * 0xd);
  QRect::right(&this->mGridRect);
  QWidget::setMinimumWidth((int)this);
  iVar1 = QWidget::height(&this->super_QWidget);
  iVar1 = CellPainter::calculateRowsAvailable(&this->mCellPainter,iVar1);
  this->mVisibleRows = iVar1;
  return;
}

Assistant:

void OrderGrid::fontChanged() {
    mCellPainter.setFont(font());

    auto const cellWidth = mCellPainter.cellWidth();

    mGridRect.setX(2 * (SPACING + cellWidth) + LINE_WIDTH);
    mGridRect.setWidth(13 * cellWidth);

    // determine minimum width
    setMinimumWidth(mGridRect.right());

    mVisibleRows = mCellPainter.calculateRowsAvailable(height());
}